

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OFFReader.cc
# Opt level: O3

int __thiscall
OpenMesh::IO::_OFFReader_::getColorType(_OFFReader_ *this,string *_line,bool _texCoordsAvailable)

{
  size_type *psVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  size_type sVar5;
  undefined1 *local_50;
  string c1;
  
  sVar5 = _line->_M_string_length;
  if (sVar5 == 0) {
    iVar2 = 0;
  }
  else {
    psVar1 = &c1._M_string_length;
    iVar2 = isspace((int)*(_line->_M_dataplus)._M_p);
    if (iVar2 != 0) {
      do {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)_line);
        std::__cxx11::string::operator=((string *)_line,(string *)&local_50);
        if ((size_type *)local_50 != psVar1) {
          operator_delete(local_50);
        }
        sVar5 = _line->_M_string_length;
        if (sVar5 == 0) goto LAB_00177a48;
        iVar2 = isspace((int)*(_line->_M_dataplus)._M_p);
      } while (iVar2 != 0);
    }
    do {
      iVar2 = isspace((int)(_line->_M_dataplus)._M_p[sVar5 - 1]);
      if (iVar2 == 0) break;
      std::__cxx11::string::substr((ulong)&local_50,(ulong)_line);
      std::__cxx11::string::operator=((string *)_line,(string *)&local_50);
      if ((size_type *)local_50 != psVar1) {
        operator_delete(local_50);
      }
      sVar5 = _line->_M_string_length;
    } while (sVar5 != 0);
LAB_00177a48:
    iVar2 = 0;
    lVar3 = std::__cxx11::string::find_first_of((char *)_line,0x1a79a6,0);
    if (lVar3 != -1) {
      iVar2 = 0;
      do {
        iVar2 = iVar2 + 1;
        lVar3 = std::__cxx11::string::find_first_of((char *)_line,0x1a79a6,lVar3 + 1);
      } while (lVar3 != -1);
    }
    iVar4 = (iVar2 + 1) - (uint)(_line->_M_string_length == 0);
    iVar2 = iVar4 + -2;
    if (!_texCoordsAvailable) {
      iVar2 = iVar4;
    }
    if (iVar2 - 3U < 2) {
      std::__cxx11::string::find((char *)_line,0x1a79a6,0);
      std::__cxx11::string::substr((ulong)&local_50,(ulong)_line);
      lVar3 = std::__cxx11::string::find((char *)&local_50,0x1a614a,0);
      iVar4 = (iVar2 != 3) + 5;
      if (lVar3 == -1) {
        iVar4 = iVar2;
      }
      iVar2 = iVar4;
      if ((size_type *)local_50 != psVar1) {
        operator_delete(local_50);
      }
    }
  }
  return iVar2;
}

Assistant:

int _OFFReader_::getColorType(std::string& _line, bool _texCoordsAvailable) const
{
/*
  0 : no Color
  1 : one int (e.g colormap index)
  2 : two items (error!)
  3 : 3 ints
  4 : 3 ints
  5 : 3 floats
  6 : 4 floats

*/
	// Check if we have any additional information here
	if ( _line.size() < 1 )
		return 0;

    //first remove spaces at start/end of the line
    while (_line.size() > 0 && std::isspace(_line[0]))
      _line = _line.substr(1);
    while (_line.size() > 0 && std::isspace(_line[ _line.length()-1 ]))
      _line = _line.substr(0, _line.length()-1);

    //count the remaining items in the line
    size_t found;
    int count = 0;

    found=_line.find_first_of(" ");
    while (found!=std::string::npos){
      count++;
      found=_line.find_first_of(" ",found+1);
    }

    if (!_line.empty()) count++;

    if (_texCoordsAvailable) count -= 2;

    if (count == 3 || count == 4){
      //get first item
      found = _line.find(" ");
      std::string c1 = _line.substr (0,found);

      if (c1.find(".") != std::string::npos){
        if (count == 3)
          count = 5;
        else
          count = 6;
      }
    }
  return count;
}